

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDfs.c
# Opt level: O2

int Ivy_ManIsAcyclic(Ivy_Man_t *p)

{
  int iVar1;
  uint *puVar2;
  char *pcVar3;
  int i;
  
  Ivy_ManIncrementTravId(p);
  Ivy_ManIncrementTravId(p);
  i = 0;
  while( true ) {
    if (p->vObjs->nSize <= i) {
      return 1;
    }
    puVar2 = (uint *)Vec_PtrEntry(p->vObjs,i);
    if ((puVar2 != (uint *)0x0) &&
       ((((puVar2[2] & 0xf) == 4 || ((puVar2[2] & 0xf) == 2)) &&
        (iVar1 = Ivy_ManIsAcyclic_rec(p,(Ivy_Obj_t *)(*(ulong *)(puVar2 + 4) & 0xfffffffffffffffe)),
        iVar1 == 0)))) break;
    i = i + 1;
  }
  pcVar3 = "PO";
  if ((puVar2[2] & 0xf) == 4) {
    pcVar3 = "latch";
  }
  fprintf(_stdout," (cone of %s \"%d\")\n",pcVar3,(ulong)*puVar2);
  return 0;
}

Assistant:

int Ivy_ManIsAcyclic( Ivy_Man_t * p )
{
    Ivy_Obj_t * pObj;
    int fAcyclic, i;
    // set the traversal ID for this DFS ordering
    Ivy_ManIncrementTravId( p );   
    Ivy_ManIncrementTravId( p );   
    // pObj->TravId == pNet->nTravIds      means "pObj is on the path"
    // pObj->TravId == pNet->nTravIds - 1  means "pObj is visited but is not on the path"
    // pObj->TravId <  pNet->nTravIds - 1  means "pObj is not visited"
    // traverse the network to detect cycles
    fAcyclic = 1;
    Ivy_ManForEachCo( p, pObj, i )
    {
        // traverse the output logic cone
        if ( (fAcyclic = Ivy_ManIsAcyclic_rec(p, Ivy_ObjFanin0(pObj))) )
            continue;
        // stop as soon as the first loop is detected
        fprintf( stdout, " (cone of %s \"%d\")\n", Ivy_ObjIsLatch(pObj)? "latch" : "PO", Ivy_ObjId(pObj) );
        break;
    }
    return fAcyclic;
}